

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall Player::~Player(Player *this)

{
  _Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_> *this_00;
  Hand *this_01;
  DiceRoller *this_02;
  _List_base<Observer_*,_std::allocator<Observer_*>_> *this_03;
  
  this_00 = &this->pOwnedCountries->
             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>;
  if (this_00 != (_Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_> *)0x0) {
    std::_Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>::~_Vector_base(this_00);
  }
  operator_delete(this_00,0x18);
  this_01 = this->pCards;
  if (this_01 != (Hand *)0x0) {
    Hand::~Hand(this_01);
  }
  operator_delete(this_01,8);
  this_02 = this->pDiceRoller;
  if (this_02 != (DiceRoller *)0x0) {
    DiceRoller::~DiceRoller(this_02);
  }
  operator_delete(this_02,0x10);
  operator_delete(this->pPlayerId,4);
  this_03 = &this->pObservers->super__List_base<Observer_*,_std::allocator<Observer_*>_>;
  if (this_03 != (_List_base<Observer_*,_std::allocator<Observer_*>_> *)0x0) {
    std::__cxx11::_List_base<Observer_*,_std::allocator<Observer_*>_>::_M_clear(this_03);
  }
  operator_delete(this_03,0x18);
  operator_delete(this->currentState,4);
  if (this->strategy != (PlayerStrategy *)0x0) {
    (*this->strategy->_vptr_PlayerStrategy[7])();
    return;
  }
  return;
}

Assistant:

Player::~Player() {
    delete pOwnedCountries;
    delete pCards;
    delete pDiceRoller;
    delete pPlayerId;
    delete pObservers;
    delete currentState;
    delete strategy;
}